

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

int __thiscall
GrcSymbolTable::AddGlyphAttrSymbolInMap
          (GrcSymbolTable *this,
          vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *vpsymGlyphAttrIDs,
          Symbol psymGeneric,int ipsymToAssign)

{
  pointer *pppGVar1;
  pointer ppGVar2;
  iterator __position;
  Symbol local_28;
  GrcSymbolTableEntry *local_20;
  
  ppGVar2 = (vpsymGlyphAttrIDs->
            super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ipsymToAssign <
      (int)((ulong)((long)(vpsymGlyphAttrIDs->
                          super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2) >> 3)) {
    psymGeneric->m_nInternalID = ipsymToAssign;
    ppGVar2[ipsymToAssign] = psymGeneric;
  }
  else {
    __position._M_current =
         (vpsymGlyphAttrIDs->
         super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_28 = psymGeneric;
    if ((int)((ulong)((long)__position._M_current -
                     (long)(vpsymGlyphAttrIDs->
                           super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) < ipsymToAssign) {
      do {
        local_20 = (GrcSymbolTableEntry *)0x0;
        if (__position._M_current ==
            (vpsymGlyphAttrIDs->
            super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<GrcSymbolTableEntry*,std::allocator<GrcSymbolTableEntry*>>::
          _M_realloc_insert<GrcSymbolTableEntry*>
                    ((vector<GrcSymbolTableEntry*,std::allocator<GrcSymbolTableEntry*>> *)
                     vpsymGlyphAttrIDs,__position,&local_20);
        }
        else {
          *__position._M_current = (GrcSymbolTableEntry *)0x0;
          pppGVar1 = &(vpsymGlyphAttrIDs->
                      super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppGVar1 = *pppGVar1 + 1;
        }
        __position._M_current =
             (vpsymGlyphAttrIDs->
             super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
      } while ((int)((ulong)((long)__position._M_current -
                            (long)(vpsymGlyphAttrIDs->
                                  super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3) < ipsymToAssign)
      ;
    }
    local_28->m_nInternalID = ipsymToAssign;
    if (__position._M_current ==
        (vpsymGlyphAttrIDs->
        super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<GrcSymbolTableEntry*,std::allocator<GrcSymbolTableEntry*>>::
      _M_realloc_insert<GrcSymbolTableEntry*const&>
                ((vector<GrcSymbolTableEntry*,std::allocator<GrcSymbolTableEntry*>> *)
                 vpsymGlyphAttrIDs,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      pppGVar1 = &(vpsymGlyphAttrIDs->
                  super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppGVar1 = *pppGVar1 + 1;
    }
  }
  return ipsymToAssign;
}

Assistant:

int GrcSymbolTable::AddGlyphAttrSymbolInMap(std::vector<Symbol> & vpsymGlyphAttrIDs,
	Symbol psymGeneric, int ipsymToAssign)
{
	if (signed(vpsymGlyphAttrIDs.size()) > ipsymToAssign)
	{
		Assert(vpsymGlyphAttrIDs[ipsymToAssign] == NULL ||
			vpsymGlyphAttrIDs[ipsymToAssign] == psymGeneric);
		psymGeneric->SetInternalID(ipsymToAssign);
		vpsymGlyphAttrIDs[ipsymToAssign] = psymGeneric;
		return ipsymToAssign;
	}